

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

void __thiscall
Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>>::
parse<Fixpp::impl::TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)83>,Fixpp::TagT<131u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<117u,Fixpp::Type::String>>,Fixpp::TagT<301u,Fixpp::Type::Int>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::TagT<132u,Fixpp::Type::Float>,Fixpp::TagT<133u,Fixpp::Type::Float>,Fixpp::TagT<134u,Fixpp::Type::Float>,Fixpp::TagT<135u,Fixpp::Type::Float>,Fixpp::TagT<62u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<188u,Fixpp::Type::Float>,Fixpp::TagT<190u,Fixpp::Type::Float>,Fixpp::TagT<189u,Fixpp::Type::Float>,Fixpp::TagT<191u,Fixpp::Type::Float>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<64u,Fixpp::Type::String>,Fixpp::TagT<40u,Fixpp::Type::Char>,Fixpp::TagT<193u,Fixpp::Type::String>,Fixpp::TagT<192u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>>>>
          (FieldParser<Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>> *this,Field *field,
          ParsingContext *context,
          TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_S_>,_Fixpp::TagT<131U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<117U,_Fixpp::Type::String>_>,_Fixpp::TagT<301U,_Fixpp::Type::Int>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::TagT<132U,_Fixpp::Type::Float>,_Fixpp::TagT<133U,_Fixpp::Type::Float>,_Fixpp::TagT<134U,_Fixpp::Type::Float>,_Fixpp::TagT<135U,_Fixpp::Type::Float>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<188U,_Fixpp::Type::Float>,_Fixpp::TagT<190U,_Fixpp::Type::Float>,_Fixpp::TagT<189U,_Fixpp::Type::Float>,_Fixpp::TagT<191U,_Fixpp::Type::Float>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<40U,_Fixpp::Type::Char>,_Fixpp::TagT<193U,_Fixpp::Type::String>,_Fixpp::TagT<192U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>_>_>
          *tagSet,bool param_4,bool param_5)

{
  StreamCursor *cursor_00;
  bool bVar1;
  uint tag;
  undefined1 local_70 [8];
  pair<const_char_*,_unsigned_long> view;
  Token valueToken;
  StreamCursor *cursor;
  bool param_5_local;
  bool param_4_local;
  TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_S_>,_Fixpp::TagT<131U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<117U,_Fixpp::Type::String>_>,_Fixpp::TagT<301U,_Fixpp::Type::Int>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::TagT<132U,_Fixpp::Type::Float>,_Fixpp::TagT<133U,_Fixpp::Type::Float>,_Fixpp::TagT<134U,_Fixpp::Type::Float>,_Fixpp::TagT<135U,_Fixpp::Type::Float>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<188U,_Fixpp::Type::Float>,_Fixpp::TagT<190U,_Fixpp::Type::Float>,_Fixpp::TagT<189U,_Fixpp::Type::Float>,_Fixpp::TagT<191U,_Fixpp::Type::Float>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<40U,_Fixpp::Type::Char>,_Fixpp::TagT<193U,_Fixpp::Type::String>,_Fixpp::TagT<192U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>_>_>
  *tagSet_local;
  ParsingContext *context_local;
  Field *field_local;
  FieldParser<Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>_> *this_local;
  
  cursor_00 = context->cursor;
  StreamCursor::Token::Token((Token *)&view.second,context->cursor);
  bVar1 = match_until_fast('|',cursor_00);
  if (bVar1) {
    _local_70 = StreamCursor::Token::view((Token *)&view.second);
    bVar1 = StreamCursor::advance(cursor_00,1);
    if (bVar1) {
      FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>::set(field,(View *)local_70);
      tag = FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>::tag(field);
      TagSet<Fixpp::TagT<131U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<117U,_Fixpp::Type::String>_>,_Fixpp::TagT<301U,_Fixpp::Type::Int>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::TagT<132U,_Fixpp::Type::Float>,_Fixpp::TagT<133U,_Fixpp::Type::Float>,_Fixpp::TagT<134U,_Fixpp::Type::Float>,_Fixpp::TagT<135U,_Fixpp::Type::Float>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<188U,_Fixpp::Type::Float>,_Fixpp::TagT<190U,_Fixpp::Type::Float>,_Fixpp::TagT<189U,_Fixpp::Type::Float>,_Fixpp::TagT<191U,_Fixpp::Type::Float>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<40U,_Fixpp::Type::Char>,_Fixpp::TagT<193U,_Fixpp::Type::String>,_Fixpp::TagT<192U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>_>
      ::set(&tagSet->
             super_TagSet<Fixpp::TagT<131U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<117U,_Fixpp::Type::String>_>,_Fixpp::TagT<301U,_Fixpp::Type::Int>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::TagT<132U,_Fixpp::Type::Float>,_Fixpp::TagT<133U,_Fixpp::Type::Float>,_Fixpp::TagT<134U,_Fixpp::Type::Float>,_Fixpp::TagT<135U,_Fixpp::Type::Float>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<188U,_Fixpp::Type::Float>,_Fixpp::TagT<190U,_Fixpp::Type::Float>,_Fixpp::TagT<189U,_Fixpp::Type::Float>,_Fixpp::TagT<191U,_Fixpp::Type::Float>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<40U,_Fixpp::Type::Char>,_Fixpp::TagT<193U,_Fixpp::Type::String>,_Fixpp::TagT<192U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>_>
            ,tag);
    }
    else {
      ParsingContext::setError(context,Incomplete,"Expected value after tag \'%d\', got EOF",0x30);
    }
  }
  else {
    ParsingContext::setError(context,ParsingError,"Expected value tag \'%d\', got EOF",0x30);
  }
  return;
}

Assistant:

void parse(Field& field, ParsingContext& context, TagSet& tagSet, bool /* strict */, bool /* skipUnknown */)
            {
                auto& cursor = context.cursor;
                // @Todo: In Strict mode, validate the type of the Tag
                StreamCursor::Token valueToken(context.cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value tag '%d', got EOF", TagT::Id);

                auto view = valueToken.view();
                TRY_ADVANCE("Expected value after tag '%d', got EOF", TagT::Id);

                field.set(view);
                tagSet.set(field.tag());
            }